

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ATN.hpp
# Opt level: O2

void __thiscall Centaurus::ATNNode<unsigned_char>::~ATNNode(ATNNode<unsigned_char> *this)

{
  this->_vptr_ATNNode = (_func_int **)&PTR__ATNNode_001a0728;
  std::__cxx11::
  basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>::
  ~basic_string(&this->m_literal);
  NFABase<Centaurus::NFABaseState<unsigned_char,_int>_>::~NFABase
            (&(this->m_nfa).super_NFABase<Centaurus::NFABaseState<unsigned_char,_int>_>);
  Identifier::~Identifier(&this->m_invoke);
  std::
  vector<Centaurus::ATNTransition<unsigned_char>,_std::allocator<Centaurus::ATNTransition<unsigned_char>_>_>
  ::~vector(&this->m_transitions);
  return;
}

Assistant:

void add_transition(const ATNTransition<TCHAR>& transition)
    {
        m_transitions.push_back(transition);
    }